

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O1

void __thiscall
de::ArrayBuffer<unsigned_int,_4UL,_4UL>::ArrayBuffer
          (ArrayBuffer<unsigned_int,_4UL,_4UL> *this,ArrayBuffer<unsigned_int,_4UL,_4UL> *other)

{
  size_t sVar1;
  void *ptr;
  ArrayBuffer<unsigned_int,_4UL,_4UL> tmp;
  ArrayBuffer<unsigned_int,_4UL,_4UL> local_38;
  
  this->m_ptr = (void *)0x0;
  this->m_cap = 0;
  sVar1 = other->m_cap;
  if (sVar1 != 0) {
    ArrayBuffer(&local_38,sVar1);
    memcpy(local_38.m_ptr,other->m_ptr,(long)((int)sVar1 << 2));
    ptr = this->m_ptr;
    sVar1 = this->m_cap;
    this->m_ptr = local_38.m_ptr;
    this->m_cap = local_38.m_cap;
    local_38.m_ptr = ptr;
    local_38.m_cap = sVar1;
    detail::ArrayBuffer_AlignedFree(ptr);
  }
  return;
}

Assistant:

ArrayBuffer<T,Alignment,Stride>::ArrayBuffer (const ArrayBuffer<T,Alignment,Stride>& other)
	: m_ptr	(DE_NULL)
	, m_cap	(0)
{
	if (other.m_cap)
	{
		// copy to temporary and swap to it

		const size_t	storageSize =	(other.m_cap - 1) * Stride + sizeof(T);
		ArrayBuffer		tmp				(other.m_cap);

		deMemcpy(tmp.m_ptr, other.m_ptr, (int)storageSize);
		swap(tmp);
	}
}